

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgstrf.c
# Opt level: O1

void zgstrf(superlu_options_t *options,SuperMatrix *A,int relax,int panel_size,int *etree,void *work
           ,int_t lwork,int *perm_c,int *perm_r,SuperMatrix *L,SuperMatrix *U,GlobalLU_t *Glu,
           SuperLUStat_t *stat,int_t *info)

{
  uint n;
  int iVar1;
  int_t *piVar2;
  double dVar3;
  superlu_options_t *psVar4;
  int iVar5;
  uint n_00;
  int_t iVar6;
  int_t iVar7;
  uint uVar8;
  int iVar9;
  int *piVar10;
  ulong uVar11;
  superlu_options_t *addr;
  int_t *piVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  double *pdVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  int nseg;
  superlu_options_t *local_178;
  int *repfnz;
  int *segrep;
  fact_t local_160;
  int nseg1;
  int *local_158;
  ulong local_150;
  doublecomplex *dense;
  int_t *xprune;
  int *marker;
  int_t nnzU;
  int_t nnzL;
  int usepr;
  int pivrow;
  int_t nzlumax;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  int_t *local_f8;
  int *local_f0;
  doublecomplex *tempv;
  int_t *xplore;
  int local_d4;
  int_t *local_d0;
  int_t *local_c8;
  int *local_c0;
  int *local_b8;
  SuperMatrix *local_b0;
  int *local_a8;
  int_t *local_a0;
  int_t *local_98;
  int_t *local_90;
  double local_88;
  int *panel_lsub;
  int *parent;
  doublecomplex *zwork;
  int *iwork;
  int_t *local_60;
  int_t *local_58;
  long local_50;
  long local_48;
  flops_t *local_40;
  long local_38;
  
  local_150 = CONCAT44(local_150._4_4_,relax);
  local_158 = etree;
  iVar5 = sp_ienv(6);
  local_160 = options->Fact;
  local_88 = options->DiagPivotThresh;
  local_a8 = stat->panel_histo;
  local_40 = stat->ops;
  uVar8 = A->nrow;
  local_118 = (ulong)uVar8;
  n = A->ncol;
  local_110 = (ulong)n;
  n_00 = n;
  if ((int)uVar8 < (int)n) {
    n_00 = uVar8;
  }
  piVar12 = (int_t *)A->Store;
  local_38 = *(long *)(piVar12 + 2);
  local_90 = *(int_t **)(piVar12 + 4);
  local_98 = *(int_t **)(piVar12 + 6);
  local_a0 = *(int_t **)(piVar12 + 8);
  local_108 = (ulong)(uint)panel_size;
  local_b0 = A;
  iVar6 = zLUMemInit(local_160,work,lwork,uVar8,n,*piVar12,panel_size,(double)iVar5,L,U,Glu,&iwork,
                     &zwork);
  uVar15 = local_110;
  uVar16 = local_118;
  *info = iVar6;
  if (iVar6 == 0) {
    local_b8 = Glu->xsup;
    local_c0 = Glu->supno;
    local_c8 = Glu->xlsub;
    local_d0 = Glu->xlusup;
    local_f8 = Glu->xusub;
    iVar20 = (int)local_118;
    iVar18 = (int)local_110;
    iVar5 = (int)local_108;
    local_178 = options;
    SetIWork(iVar20,iVar18,iVar5,iwork,&segrep,&parent,&xplore,&repfnz,&panel_lsub,&xprune,&marker);
    zSetRWork(iVar20,iVar5,zwork,&dense,&tempv);
    usepr = (int)(local_160 == SamePattern_SameRowPerm);
    if (local_160 == SamePattern_SameRowPerm) {
      piVar10 = int32Malloc(iVar20);
      if (0 < iVar20) {
        uVar11 = 0;
        do {
          piVar10[perm_r[uVar11]] = (int)uVar11;
          uVar11 = uVar11 + 1;
        } while (uVar16 != uVar11);
      }
    }
    else {
      piVar10 = (int *)0x0;
    }
    psVar4 = local_178;
    addr = (superlu_options_t *)int32Malloc(iVar18);
    if (0 < iVar18) {
      uVar16 = 0;
      do {
        (&addr->Fact)[perm_c[uVar16]] = (fact_t)uVar16;
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
    piVar12 = intMalloc(iVar18);
    local_f0 = piVar10;
    if (psVar4->SymmetricMode == YES) {
      heap_relax_snode(iVar18,local_158,(int)local_150,marker,piVar12);
    }
    else {
      relax_snode(iVar18,local_158,(int)local_150,marker,piVar12);
    }
    uVar16 = local_118;
    iVar20 = (int)local_118;
    ifill(perm_r,iVar20,-1);
    ifill(marker,iVar20 * 3,-1);
    *local_c0 = -1;
    iVar5 = 0;
    *local_d0 = 0;
    *local_f8 = 0;
    *local_c8 = 0;
    *local_b8 = 0;
    if (0 < (int)n_00) {
      local_60 = piVar12 + 1;
      local_50 = (long)iVar20 * 4;
      local_48 = (long)iVar20 << 4;
      uVar15 = 0;
      iVar5 = 0;
      local_178 = addr;
      local_58 = piVar12;
      do {
        iVar18 = (int)uVar15;
        uVar11 = (ulong)iVar18;
        iVar20 = local_58[uVar11];
        if (iVar20 == -1) {
          local_150 = uVar15 & 0xffffffff;
          uVar8 = (int)local_108 + iVar18;
          if ((int)n_00 <= (int)uVar8) {
            uVar8 = n_00;
          }
          uVar15 = 0;
          do {
            if ((long)(int)uVar8 <= (long)(uVar11 + 1 + uVar15)) {
              uVar8 = iVar18 + (int)uVar15 + 1;
              uVar14 = local_108;
              goto LAB_00102f1a;
            }
            uVar14 = uVar15 + 1;
            lVar13 = uVar11 + uVar15;
            uVar15 = uVar14;
          } while (local_60[lVar13] == -1);
          uVar8 = iVar18 + (int)uVar14;
LAB_00102f1a:
          iVar20 = n_00 - iVar18;
          if (uVar8 != n_00) {
            iVar20 = (int)uVar14;
          }
          local_a8[iVar20] = local_a8[iVar20] + 1;
          zpanel_dfs((int)uVar16,iVar20,iVar18,local_b0,perm_r,&nseg1,dense,panel_lsub,segrep,repfnz
                     ,xprune,marker,parent,xplore,Glu);
          zpanel_bmod((int)uVar16,iVar20,iVar18,nseg1,dense,tempv,segrep,repfnz,Glu,stat);
          uVar15 = (ulong)(uint)(iVar18 + iVar20);
          if (0 < iVar20) {
            local_158 = (int *)(long)(iVar18 + iVar20);
            lVar19 = 0;
            lVar13 = 0;
            local_100 = uVar15;
            do {
              nseg = nseg1;
              iVar18 = (int)uVar11;
              iVar20 = zcolumn_dfs((int)local_118,iVar18,perm_r,&nseg,
                                   (int *)((long)panel_lsub + lVar13),segrep,
                                   (int *)((long)repfnz + lVar13),xprune,marker,parent,xplore,Glu);
              *info = iVar20;
              if (iVar20 != 0) {
                return;
              }
              iVar20 = zcolumn_bmod(iVar18,nseg - nseg1,(doublecomplex *)((long)&dense->r + lVar19),
                                    tempv,segrep + nseg1,(int *)((long)repfnz + lVar13),
                                    (int)local_150,Glu,stat);
              *info = iVar20;
              if (iVar20 != 0) {
                return;
              }
              iVar20 = zcopy_to_ucol(iVar18,nseg,segrep,(int *)((long)repfnz + lVar13),perm_r,
                                     (doublecomplex *)((long)&dense->r + lVar19),Glu);
              *info = iVar20;
              if (iVar20 != 0) {
                return;
              }
              iVar9 = zpivotL(iVar18,local_88,&usepr,perm_r,local_f0,(int *)local_178,&pivrow,Glu,
                              stat);
              *info = iVar9;
              iVar20 = iVar5;
              if (iVar5 == 0) {
                iVar20 = iVar9;
              }
              if (iVar9 != 0) {
                iVar5 = iVar20;
              }
              zpruneL(iVar18,perm_r,pivrow,nseg,segrep,(int *)((long)repfnz + lVar13),xprune,Glu);
              resetrep_col(nseg,segrep,(int *)((long)repfnz + lVar13));
              uVar11 = uVar11 + 1;
              lVar13 = lVar13 + local_50;
              lVar19 = lVar19 + local_48;
              uVar15 = local_100;
            } while ((long)uVar11 < (long)local_158);
          }
        }
        else {
          local_a8[(long)(iVar20 - iVar18) + 1] = local_a8[(long)(iVar20 - iVar18) + 1] + 1;
          local_d4 = iVar20;
          iVar6 = zsnode_dfs(iVar18,iVar20,local_90,local_98,local_a0,xprune,marker,Glu);
          *info = iVar6;
          if (iVar6 != 0) {
            return;
          }
          local_150 = CONCAT44(local_150._4_4_,local_f8[uVar11]);
          iVar6 = local_d0[uVar11];
          local_158 = (int *)(long)local_c0[uVar11];
          local_100 = (ulong)local_b8[(long)local_158];
          iVar9 = local_c8[local_100 + 1];
          iVar1 = local_c8[local_100];
          nzlumax = Glu->nzlumax;
          while (nzlumax < (iVar9 - iVar1) * ((iVar20 - iVar18) + 1) + iVar6) {
            iVar7 = zLUMemXpand(iVar18,iVar6,LUSUP,&nzlumax,Glu);
            *info = iVar7;
            if (iVar7 != 0) {
              return;
            }
          }
          if (iVar18 <= local_d4) {
            iVar20 = local_d4 + 1;
            do {
              local_f8[uVar11 + 1] = (int)local_150;
              lVar13 = (long)local_98[uVar11];
              if (local_98[uVar11] < local_a0[uVar11]) {
                pdVar17 = (double *)(lVar13 * 0x10 + local_38);
                do {
                  iVar18 = local_90[lVar13];
                  dVar3 = pdVar17[1];
                  dense[iVar18].r = *pdVar17;
                  dense[iVar18].i = dVar3;
                  lVar13 = lVar13 + 1;
                  pdVar17 = pdVar17 + 2;
                } while (lVar13 < local_a0[uVar11]);
              }
              uVar15 = uVar11 + 1;
              zsnode_bmod((int)uVar11,(int)local_158,(int)local_100,dense,tempv,Glu,stat);
              iVar9 = zpivotL((int)uVar11,local_88,&usepr,perm_r,local_f0,(int *)local_178,&pivrow,
                              Glu,stat);
              *info = iVar9;
              iVar18 = iVar5;
              if (iVar5 == 0) {
                iVar18 = iVar9;
              }
              if (iVar9 != 0) {
                iVar5 = iVar18;
              }
              uVar11 = uVar15;
            } while (iVar20 != (int)uVar15);
          }
        }
        addr = local_178;
        uVar16 = local_118;
        piVar12 = local_58;
      } while ((int)uVar15 < (int)n_00);
    }
    *info = iVar5;
    iVar20 = iVar5 + -1;
    if (iVar5 == 0) {
      iVar20 = (int)local_110;
    }
    iVar5 = (int)uVar16;
    if (0 < iVar5 && iVar20 < iVar5) {
      uVar15 = 1;
      do {
        if (perm_r[uVar15 - 1] == -1) {
          perm_r[uVar15 - 1] = iVar20;
          iVar20 = iVar20 + 1;
        }
      } while ((uVar15 < uVar16) && (uVar15 = uVar15 + 1, iVar20 < iVar5));
    }
    countnz(n_00,xprune,&nnzL,&nnzU,Glu);
    fixupL(n_00,perm_r,Glu);
    zLUWorkFree(iwork,zwork,Glu);
    superlu_free(xplore);
    superlu_free(xprune);
    if (local_160 == SamePattern_SameRowPerm) {
      piVar2 = (int_t *)L->Store;
      *piVar2 = nnzL;
      piVar2[1] = Glu->supno[(int)local_110];
      *(void **)(piVar2 + 2) = Glu->lusup;
      *(int_t **)(piVar2 + 4) = Glu->xlusup;
      *(int_t **)(piVar2 + 6) = Glu->lsub;
      *(int_t **)(piVar2 + 8) = Glu->xlsub;
      piVar2 = (int_t *)U->Store;
      *piVar2 = nnzU;
      *(void **)(piVar2 + 2) = Glu->ucol;
      *(int_t **)(piVar2 + 4) = Glu->usub;
      *(int_t **)(piVar2 + 6) = Glu->xusub;
    }
    else {
      zCreate_SuperNode_Matrix
                (L,local_b0->nrow,n_00,nnzL,(doublecomplex *)Glu->lusup,Glu->xlusup,Glu->lsub,
                 Glu->xlsub,Glu->supno,Glu->xsup,SLU_SC,SLU_Z,SLU_TRLU);
      zCreate_CompCol_Matrix
                (U,n_00,n_00,nnzU,(doublecomplex *)Glu->ucol,Glu->usub,Glu->xusub,SLU_NC,SLU_Z,
                 SLU_TRU);
    }
    local_40[7] = local_40[0x13] + local_40[0x14] + local_40[7];
    iVar5 = Glu->num_expansions + -1;
    Glu->num_expansions = iVar5;
    stat->expansions = iVar5;
    if (local_160 == SamePattern_SameRowPerm) {
      superlu_free(local_f0);
    }
    superlu_free(addr);
    superlu_free(piVar12);
  }
  return;
}

Assistant:

void
zgstrf (superlu_options_t *options, SuperMatrix *A,
        int relax, int panel_size, int *etree, void *work, int_t lwork,
        int *perm_c, int *perm_r, SuperMatrix *L, SuperMatrix *U,
    	GlobalLU_t *Glu, /* persistent to facilitate multiple factorizations */
        SuperLUStat_t *stat, int_t *info)
{
    /* Local working arrays */
    NCPformat *Astore;
    int       *iperm_r = NULL; /* inverse of perm_r; used when 
                                  options->Fact == SamePattern_SameRowPerm */
    int       *iperm_c; /* inverse of perm_c */
    int       *iwork;
    doublecomplex    *zwork;
    int	      *segrep, *repfnz, *parent;
    int	      *panel_lsub; /* dense[]/panel_lsub[] pair forms a w-wide SPA */
    int_t     *xprune, *xplore;
    int	      *marker;
    doublecomplex    *dense, *tempv;
    int       *relax_end;
    doublecomplex    *a;
    int_t     *asub, *xa_begin, *xa_end;
    int_t     *xlsub, *xlusup, *xusub;
    int       *xsup, *supno;
    int_t     nzlumax;
    double fill_ratio = sp_ienv(6);  /* estimated fill ratio */

    /* Local scalars */
    fact_t    fact = options->Fact;
    double    diag_pivot_thresh = options->DiagPivotThresh;
    int       pivrow;   /* pivotal row number in the original matrix A */
    int       nseg1;	/* no of segments in U-column above panel row jcol */
    int       nseg;	/* no of segments in each U-column */
    register int jcol, jj;
    register int kcol;	/* end column of a relaxed snode */
    register int icol;
    int_t     i, k, iinfo, new_next, nextlu, nextu;
    int       m, n, min_mn, jsupno, fsupc;
    int       w_def;	/* upper bound on panel width */
    int       usepr, iperm_r_allocated = 0;
    int_t     nnzL, nnzU;
    int       *panel_histo = stat->panel_histo;
    flops_t   *ops = stat->ops;

    iinfo    = 0;
    m        = A->nrow;
    n        = A->ncol;
    min_mn   = SUPERLU_MIN(m, n);
    Astore   = A->Store;
    a        = Astore->nzval;
    asub     = Astore->rowind;
    xa_begin = Astore->colbeg;
    xa_end   = Astore->colend;

    /* Allocate storage common to the factor routines */
    *info = zLUMemInit(fact, work, lwork, m, n, Astore->nnz,
                       panel_size, fill_ratio, L, U, Glu, &iwork, &zwork);
    if ( *info ) return;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    xlsub   = Glu->xlsub;
    xlusup  = Glu->xlusup;
    xusub   = Glu->xusub;
    
    SetIWork(m, n, panel_size, iwork, &segrep, &parent, &xplore,
	     &repfnz, &panel_lsub, &xprune, &marker);
    zSetRWork(m, panel_size, zwork, &dense, &tempv);
    
    usepr = (fact == SamePattern_SameRowPerm);
    if ( usepr ) {
	/* Compute the inverse of perm_r */
	iperm_r = (int *) int32Malloc(m);
	for (k = 0; k < m; ++k) iperm_r[perm_r[k]] = k;
	iperm_r_allocated = 1;
    }
    iperm_c = (int *) int32Malloc(n);
    for (k = 0; k < n; ++k) iperm_c[perm_c[k]] = k;

    /* Identify relaxed snodes */
    relax_end = (int *) intMalloc(n);
    if ( options->SymmetricMode == YES ) {
        heap_relax_snode(n, etree, relax, marker, relax_end); 
    } else {
        relax_snode(n, etree, relax, marker, relax_end); 
    }
    
    ifill (perm_r, m, SLU_EMPTY);
    ifill (marker, m * NO_MARKER, SLU_EMPTY);
    supno[0] = -1;
    xsup[0]  = xlsub[0] = xusub[0] = xlusup[0] = 0;
    w_def    = panel_size;

    /* 
     * Work on one "panel" at a time. A panel is one of the following: 
     *	   (a) a relaxed supernode at the bottom of the etree, or
     *	   (b) panel_size contiguous columns, defined by the user
     */
    for (jcol = 0; jcol < min_mn; ) {

	if ( relax_end[jcol] != SLU_EMPTY ) { /* start of a relaxed snode */
   	    kcol = relax_end[jcol];	  /* end of the relaxed snode */
	    panel_histo[kcol-jcol+1]++;

	    /* --------------------------------------
	     * Factorize the relaxed supernode(jcol:kcol) 
	     * -------------------------------------- */
	    /* Determine the union of the row structure of the snode */
	    if ( (*info = zsnode_dfs(jcol, kcol, asub, xa_begin, xa_end,
				    xprune, marker, Glu)) != 0 )
		return;

            nextu    = xusub[jcol];
	    nextlu   = xlusup[jcol];
	    jsupno   = supno[jcol];
	    fsupc    = xsup[jsupno];
	    new_next = nextlu + (xlsub[fsupc+1]-xlsub[fsupc])*(kcol-jcol+1);
	    nzlumax = Glu->nzlumax;
	    while ( new_next > nzlumax ) {
		if ( (*info = zLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu)) )
		    return;
	    }
    
	    for (icol = jcol; icol<= kcol; icol++) {
		xusub[icol+1] = nextu;
		
    		/* Scatter into SPA dense[*] */
    		for (k = xa_begin[icol]; k < xa_end[icol]; k++)
        	    dense[asub[k]] = a[k];

	       	/* Numeric update within the snode */
	        zsnode_bmod(icol, jsupno, fsupc, dense, tempv, Glu, stat);

		if ( (*info = zpivotL(icol, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;
		
#if ( DEBUGlevel>=2 )
		zprint_lu_col("[1]: ", icol, pivrow, xprune, Glu);
#endif

	    }

	    jcol = icol;

	} else { /* Work on one panel of panel_size columns */
	    
	    /* Adjust panel_size so that a panel won't overlap with the next 
	     * relaxed snode.
	     */
	    panel_size = w_def;
	    for (k = jcol + 1; k < SUPERLU_MIN(jcol+panel_size, min_mn); k++) 
		if ( relax_end[k] != SLU_EMPTY ) {
		    panel_size = k - jcol;
		    break;
		}
	    if ( k == min_mn ) panel_size = min_mn - jcol;
	    panel_histo[panel_size]++;

	    /* symbolic factor on a panel of columns */
	    zpanel_dfs(m, panel_size, jcol, A, perm_r, &nseg1,
		      dense, panel_lsub, segrep, repfnz, xprune,
		      marker, parent, xplore, Glu);
	    
	    /* numeric sup-panel updates in topological order */
	    zpanel_bmod(m, panel_size, jcol, nseg1, dense,
		        tempv, segrep, repfnz, Glu, stat);
	    
	    /* Sparse LU within the panel, and below panel diagonal */
    	    for ( jj = jcol; jj < jcol + panel_size; jj++) {
 		k = (jj - jcol) * m; /* column index for w-wide arrays */

		nseg = nseg1;	/* Begin after all the panel segments */

	    	if ((*info = zcolumn_dfs(m, jj, perm_r, &nseg, &panel_lsub[k],
					segrep, &repfnz[k], xprune, marker,
					parent, xplore, Glu)) != 0) return;

	      	/* Numeric updates */
	    	if ((*info = zcolumn_bmod(jj, (nseg - nseg1), &dense[k],
					 tempv, &segrep[nseg1], &repfnz[k],
					 jcol, Glu, stat)) != 0) return;
		
	        /* Copy the U-segments to ucol[*] */
		if ((*info = zcopy_to_ucol(jj, nseg, segrep, &repfnz[k],
					  perm_r, &dense[k], Glu)) != 0)
		    return;

	    	if ( (*info = zpivotL(jj, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;

		/* Prune columns (0:jj-1) using column jj */
	    	zpruneL(jj, perm_r, pivrow, nseg, segrep,
                        &repfnz[k], xprune, Glu);

		/* Reset repfnz[] for this column */
	    	resetrep_col (nseg, segrep, &repfnz[k]);
		
#if ( DEBUGlevel>=2 )
		zprint_lu_col("[2]: ", jj, pivrow, xprune, Glu);
#endif

	    }

   	    jcol += panel_size;	/* Move to the next panel */

	} /* else */

    } /* for */

    *info = iinfo;

    /* Complete perm_r[] for rank-deficient or tall-skinny matrices */
    /* k is the rank of U
       pivots have been completed for rows < k
       Now fill in the pivots for rows k to m */
    k = iinfo == 0 ? n : (int)iinfo - 1;
    if (m > k) {
        /* if k == m, then all the row permutations are complete and
           we can short circuit looking through the rest of the vector */
        for (i = 0; i < m && k < m; ++i) {
            if (perm_r[i] == SLU_EMPTY) {
                perm_r[i] = k;
                ++k;
            }

        }
    }
    
    countnz(min_mn, xprune, &nnzL, &nnzU, Glu);
    fixupL(min_mn, perm_r, Glu);

    zLUWorkFree(iwork, zwork, Glu); /* Free work space and compress storage */
    SUPERLU_FREE(xplore);
    SUPERLU_FREE(xprune);

    if ( fact == SamePattern_SameRowPerm ) {
        /* L and U structures may have changed due to possibly different
	   pivoting, even though the storage is available.
	   There could also be memory expansions, so the array locations
           may have changed, */
        ((SCformat *)L->Store)->nnz = nnzL;
	((SCformat *)L->Store)->nsuper = Glu->supno[n];
	((SCformat *)L->Store)->nzval = (doublecomplex *) Glu->lusup;
	((SCformat *)L->Store)->nzval_colptr = Glu->xlusup;
	((SCformat *)L->Store)->rowind = Glu->lsub;
	((SCformat *)L->Store)->rowind_colptr = Glu->xlsub;
	((NCformat *)U->Store)->nnz = nnzU;
	((NCformat *)U->Store)->nzval = (doublecomplex *) Glu->ucol;
	((NCformat *)U->Store)->rowind = Glu->usub;
	((NCformat *)U->Store)->colptr = Glu->xusub;
    } else {
        zCreate_SuperNode_Matrix(L, A->nrow, min_mn, nnzL, 
	      (doublecomplex *) Glu->lusup, Glu->xlusup, 
              Glu->lsub, Glu->xlsub, Glu->supno, Glu->xsup,
              SLU_SC, SLU_Z, SLU_TRLU);
    	zCreate_CompCol_Matrix(U, min_mn, min_mn, nnzU, 
	      (doublecomplex *) Glu->ucol, Glu->usub, Glu->xusub,
              SLU_NC, SLU_Z, SLU_TRU);
    }
    
    ops[FACT] += ops[TRSV] + ops[GEMV];	
    stat->expansions = --(Glu->num_expansions);
    
    if ( iperm_r_allocated ) SUPERLU_FREE (iperm_r);
    SUPERLU_FREE (iperm_c);
    SUPERLU_FREE (relax_end);

}